

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::SSBOLocalBarrierCase::iterate(SSBOLocalBarrierCase *this)

{
  ostringstream *this_00;
  RenderContext *renderCtx;
  SSBOLocalBarrierCase *pSVar1;
  int iVar2;
  ContextType type;
  GLSLVersion version;
  GLuint GVar3;
  deUint32 dVar4;
  GLenum GVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  char *__s;
  size_t sVar8;
  ostream *poVar9;
  TestError *pTVar10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  BufferMemMap bufMap;
  Buffer outputBuffer;
  InterfaceVariableInfo valueInfo;
  ShaderProgram program;
  ostringstream src;
  undefined1 auStack_4d8 [12];
  int local_4cc;
  SSBOLocalBarrierCase *local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  undefined1 local_4a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  ulong local_478;
  BufferMemMap local_470;
  int local_454;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  ObjectWrapper local_430;
  string local_418;
  undefined1 local_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  pointer local_3d8;
  deUint32 local_3d0;
  undefined8 local_3cc;
  uint uStack_3c4;
  int iStack_3c0;
  undefined5 uStack_3bc;
  undefined8 uStack_3b7;
  ios_base local_380 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_368;
  undefined1 local_348 [208];
  ShaderProgram local_278;
  long local_1a8 [14];
  ios_base local_138 [264];
  Functions *gl;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_430,(Functions *)CONCAT44(extraout_var_00,iVar2),traits);
  iVar2 = (this->m_localSize).m_data[0];
  iVar16 = (this->m_localSize).m_data[1];
  local_4cc = (this->m_workSize).m_data[1] * (this->m_workSize).m_data[0] *
              (this->m_workSize).m_data[2];
  iVar17 = (this->m_localSize).m_data[2];
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  __s = glu::getGLSLVersionDeclaration(version);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_4d8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x330);
  }
  else {
    sVar8 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout (local_size_x = ",0x17);
  poVar9 = (ostream *)std::ostream::operator<<(local_1a8,(this->m_localSize).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", local_size_y = ",0x11);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->m_localSize).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", local_size_z = ",0x11);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->m_localSize).m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"layout(binding = 0) buffer Output {\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    coherent uint values[",0x19);
  uVar15 = iVar16 * iVar2 * iVar17;
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_4cc * uVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"} sb_out;\n\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"shared uint offsets[",0x14);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n\n",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"void main (void) {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,
             "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n",
             0x50);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,
             "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
             ,0x87);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"    uint globalOffs = localSize*globalNdx;\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,
             "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
             ,0x99);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"    sb_out.values[globalOffs + localOffs] = globalOffs;\n",0x38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    memoryBarrierBuffer();\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    barrier();\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"    sb_out.values[globalOffs + ((localOffs+1u)%localSize)] += localOffs;\n",
             0x49);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    memoryBarrierBuffer();\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    barrier();\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"    sb_out.values[globalOffs + ((localOffs+2u)%localSize)] += localOffs;\n",
             0x49);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}\n",2);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_3f8,0,0xac);
  local_348._0_8_ = (pointer)0x0;
  local_348[8] = 0;
  local_348._9_7_ = 0;
  local_348[0x10] = 0;
  local_348._17_8_ = 0;
  std::__cxx11::stringbuf::str();
  local_4a0._0_4_ = 5;
  local_4a0._8_8_ = local_490._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_4a0 + 8),local_4c0._M_dataplus._M_p,
             local_4c0._M_dataplus._M_p + local_4c0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3f8 + (local_4a0._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_4a0 + 8));
  glu::ShaderProgram::ShaderProgram(&local_278,renderCtx,(ProgramSources *)local_3f8);
  if ((char *)local_4a0._8_8_ != local_490._M_local_buf + 8) {
    operator_delete((void *)local_4a0._8_8_,local_490._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  local_4c8 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_348);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_368);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3f8 + lVar14));
    pSVar1 = local_4c8;
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  glu::operator<<(((local_4c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  &local_278);
  if (local_278.m_program.m_info.linkOk == false) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x281);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_3f8._0_8_ = ((pSVar1->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_3f8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Work groups: ",0xd);
  tcu::operator<<((ostream *)this_00,&this->m_workSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_380);
  (*gl->useProgram)(local_278.m_program.m_program);
  GVar3 = (*gl->getProgramResourceIndex)(local_278.m_program.m_program,0x92e6,"Output");
  dVar4 = glu::getProgramResourceUint(gl,local_278.m_program.m_program,0x92e6,GVar3,0x9303);
  (*gl->bindBuffer)(0x90d2,local_430.m_object);
  (*gl->bufferData)(0x90d2,(long)(int)dVar4,(void *)0x0,0x88e1);
  (*gl->bindBufferBase)(0x90d2,0,local_430.m_object);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x28f);
  (*gl->dispatchCompute)
            ((pSVar1->m_workSize).m_data[0],(pSVar1->m_workSize).m_data[1],
             (pSVar1->m_workSize).m_data[2]);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x294);
  GVar3 = (*gl->getProgramResourceIndex)(local_278.m_program.m_program,0x92e6,"Output");
  dVar4 = glu::getProgramResourceUint(gl,local_278.m_program.m_program,0x92e6,GVar3,0x9303);
  GVar3 = (*gl->getProgramResourceIndex)(local_278.m_program.m_program,0x92e5,"Output.values");
  local_3f8._0_8_ = &local_3e8;
  local_3f8._8_8_ = (pointer)0x0;
  local_3e8._M_local_buf[0] = '\0';
  local_3d8 = (pointer)0xffffffffffffffff;
  local_3d0 = 0xffffffff;
  local_3cc = 0;
  uStack_3c4 = 0;
  iStack_3c0 = 0;
  uStack_3bc = 0;
  uStack_3b7 = 0;
  glu::getProgramInterfaceVariableInfo
            (gl,local_278.m_program.m_program,0x92e5,GVar3,(InterfaceVariableInfo *)local_3f8);
  BufferMemMap::BufferMemMap(&local_470,gl,0x90d2,0,dVar4,1);
  if (0 < local_4cc) {
    local_478 = (ulong)-uVar15;
    iVar16 = 0;
    lVar14 = 0;
    iVar2 = 0;
    do {
      if (0 < (int)uVar15) {
        uVar18 = 0;
        iVar17 = iVar16;
        do {
          uVar6 = (uint)uVar18;
          uVar7 = uVar6;
          if (uVar18 == 0) {
            uVar7 = uVar15;
          }
          uVar13 = 0;
          if (uVar18 < 2) {
            uVar13 = uVar15;
          }
          if (*(int *)((long)local_470.m_ptr + (long)iVar17 + (ulong)uStack_3c4) !=
              (int)(uVar7 - 1) % (int)uVar15 + iVar2 * uVar15 +
              (int)((uVar6 - 2) + uVar13) % (int)uVar15) {
            pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
            local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_450,"Comparison failed for Output.values[","");
            local_454 = uVar6 - (int)lVar14;
            de::toString<int>(&local_418,&local_454);
            std::operator+(&local_4c0,&local_450,&local_418);
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_4c0);
            local_4a0._0_8_ = *plVar11;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._0_8_ == paVar12) {
              local_490._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_490._8_8_ = plVar11[3];
              local_4a0._0_8_ = &local_490;
            }
            else {
              local_490._M_allocated_capacity = paVar12->_M_allocated_capacity;
            }
            local_4a0._8_8_ = plVar11[1];
            *plVar11 = (long)paVar12;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            tcu::TestError::TestError(pTVar10,(string *)local_4a0);
            __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          uVar18 = uVar18 + 1;
          iVar17 = iVar17 + iStack_3c0;
        } while (uVar15 != uVar18);
      }
      iVar2 = iVar2 + 1;
      lVar14 = lVar14 + local_478;
      iVar16 = iVar16 + uVar15 * iStack_3c0;
    } while (iVar2 != local_4cc);
  }
  (*(local_470.m_gl)->unmapBuffer)(local_470.m_target);
  pSVar1 = local_4c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != &local_3e8) {
    operator_delete((void *)local_3f8._0_8_,
                    CONCAT71(local_3e8._M_allocated_capacity._1_7_,local_3e8._M_local_buf[0]) + 1);
  }
  tcu::TestContext::setTestResult
            ((pSVar1->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::ShaderProgram::~ShaderProgram(&local_278);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  glu::ObjectWrapper::~ObjectWrapper(&local_430);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const int					workGroupSize	= m_localSize[0]*m_localSize[1]*m_localSize[2];
		const int					workGroupCount	= m_workSize[0]*m_workSize[1]*m_workSize[2];
		const int					numValues		= workGroupSize*workGroupCount;

		const GLSLVersion			glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream			src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "layout(binding = 0) buffer Output {\n"
			<< "    coherent uint values[" << numValues << "];\n"
			<< "} sb_out;\n\n"
			<< "shared uint offsets[" << workGroupSize << "];\n\n"
			<< "void main (void) {\n"
			<< "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
			<< "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
			<< "    uint globalOffs = localSize*globalNdx;\n"
			<< "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
			<< "\n"
			<< "    sb_out.values[globalOffs + localOffs] = globalOffs;\n"
			<< "    memoryBarrierBuffer();\n"
			<< "    barrier();\n"
			<< "    sb_out.values[globalOffs + ((localOffs+1u)%localSize)] += localOffs;\n"
			<< "    memoryBarrierBuffer();\n"
			<< "    barrier();\n"
			<< "    sb_out.values[globalOffs + ((localOffs+2u)%localSize)] += localOffs;\n"
			<< "}\n";

		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			for (int groupNdx = 0; groupNdx < workGroupCount; groupNdx++)
			{
				for (int localOffs = 0; localOffs < workGroupSize; localOffs++)
				{
					const int		globalOffs	= groupNdx*workGroupSize;
					const deUint32	res			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*(globalOffs + localOffs)));
					const int		offs0		= localOffs-1 < 0 ? ((localOffs+workGroupSize-1)%workGroupSize) : ((localOffs-1)%workGroupSize);
					const int		offs1		= localOffs-2 < 0 ? ((localOffs+workGroupSize-2)%workGroupSize) : ((localOffs-2)%workGroupSize);
					const deUint32	ref			= (deUint32)(globalOffs + offs0 + offs1);

					if (res != ref)
						throw tcu::TestError(string("Comparison failed for Output.values[") + de::toString(globalOffs + localOffs) + "]");
				}
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}